

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  istream *this;
  ostream *poVar4;
  mapped_type *pmVar5;
  pointer ppVar6;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>_> local_70;
  const_reverse_iterator m;
  int local_58;
  int local_54;
  int MH;
  int i;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mountains;
  int local_18;
  int SY;
  int SX;
  undefined4 uStack_c;
  bool discharged;
  int last_sy;
  
  uStack_c = 0;
  SX = 0x18894;
  SY._3_1_ = 0;
  do {
    this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_18);
    std::istream::operator>>
              (this,(int *)((long)&mountains._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    std::istream::ignore();
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&MH);
    for (local_54 = 0; local_54 < 8; local_54 = local_54 + 1) {
      std::istream::operator>>((istream *)&std::cin,&local_58);
      std::istream::ignore();
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_54);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_58);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      iVar1 = local_54;
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&MH,&local_58);
      *pmVar5 = iVar1;
    }
    if (SX != mountains._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
      SY._3_1_ = 0;
    }
    if ((SY._3_1_ & 1) == 0) {
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::rbegin
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_78);
      std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<int_const,int>>>::
      reverse_iterator<std::_Rb_tree_iterator<std::pair<int_const,int>>>
                ((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<int_const,int>>> *)
                 &local_70,
                 (reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_> *)local_78);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::rend
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 (local_88 + 8));
      bVar2 = std::operator!=(&local_70,
                              (reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
                               *)(local_88 + 8));
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Highest mountain is ");
        ppVar6 = std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>_>::
                 operator->(&local_70);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar6->second);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::rend
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_88);
      bVar3 = std::operator!=(&local_70,
                              (reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
                               *)local_88);
      bVar2 = false;
      if (bVar3) {
        ppVar6 = std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>_>::
                 operator->(&local_70);
        bVar2 = ppVar6->second == local_18;
      }
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cout,"FIRE");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        SY._3_1_ = 1;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"HOLD");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"HOLD");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&MH);
  } while( true );
}

Assistant:

int main()
{
    int last_sy = 100500;
    // game loop
    bool discharged = false;
    while (1)
    {
        int SX;
        int SY;
        cin >> SX >> SY;
        cin.ignore();

        typedef std::map<int, int> mountains_t;
        std::map<int, int> mountains;
        for (int i = 0; i < 8; i++)
        {
            int MH; // represents the height of one mountain, from 9 to 0. Mountain heights are provided from left to right.
            cin >> MH;
            cin.ignore();
            
            std::cerr << i << ": " << MH << std::endl;
            mountains[MH] = i;
        }
        
        if (last_sy != SY)
        {
            discharged = false;
        }

        if (!discharged)
        {
            mountains_t::const_reverse_iterator m = mountains.rbegin();
            if (m != mountains.rend())
            {
                std::cerr << "Highest mountain is " << m->second << std::endl;
            }
            if (m != mountains.rend() && m->second == SX)
            {
                std::cout << "FIRE" << std::endl;
                discharged = true;
            } else
            {
                std::cout << "HOLD" << std::endl;
            }
        } else
        {
            std::cout << "HOLD" << std::endl;
        }
    }
}